

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdns::dump_block_parameters
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int cdns_version,
          int *err,FILE *F_out)

{
  bool bVar1;
  uint local_64;
  ulong uStack_60;
  int rank_1;
  int64_t inner_val;
  int inner_type;
  int rank;
  int is_undef;
  int outer_type;
  int64_t val;
  char *p_out;
  char *pcStack_30;
  int cdns_version_local;
  char *out_max_local;
  char *out_buf_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  cdns *this_local;
  
  rank = (int)(uint)*in >> 5;
  inner_type = 0;
  p_out._4_4_ = cdns_version;
  pcStack_30 = out_max;
  out_max_local = out_buf;
  out_buf_local = (char *)in_max;
  in_max_local = in;
  in_local = (uint8_t *)this;
  in_max_local = cbor_get_number(in,in_max,(int64_t *)&is_undef);
  if (((in_max_local == (uint8_t *)0x0) || (rank != 5)) || (p_out._4_4_ != 0)) {
    if (((in_max_local == (uint8_t *)0x0) || (rank != 4)) || (p_out._4_4_ != 1)) {
      fprintf((FILE *)F_out,
              "       Error, cannot parse the first bytes of block parameters (version %d), type %d.\n"
              ,(ulong)p_out._4_4_,(ulong)(uint)rank);
      *err = -3;
      in_max_local = (uint8_t *)0x0;
    }
    else {
      local_64 = 0;
      fprintf((FILE *)F_out," [\n");
      if (_is_undef == -1) {
        inner_type = 1;
        _is_undef = 0xffffffff;
      }
      while( true ) {
        bVar1 = false;
        if ((0 < _is_undef) && (bVar1 = false, in_max_local != (uint8_t *)0x0)) {
          bVar1 = in_max_local < out_buf_local;
        }
        if (!bVar1) goto LAB_001bc122;
        if (*in_max_local == 0xff) break;
        val = (int64_t)out_max_local;
        fprintf((FILE *)F_out,"            -- Block parameter %d:\n",(ulong)local_64);
        local_64 = local_64 + 1;
        in_max_local = dump_block_parameters_rfc
                                 (this,in_max_local,(uint8_t *)out_buf_local,out_max_local,
                                  pcStack_30,err,F_out);
        _is_undef = _is_undef + -1;
      }
      fprintf((FILE *)F_out,"        --end of array");
      if (inner_type == 0) {
        fprintf((FILE *)F_out,"        Error, end of array mark unexpected.\n");
        *err = -3;
        in_max_local = (uint8_t *)0x0;
      }
      else {
        in_max_local = in_max_local + 1;
      }
LAB_001bc122:
      if (in_max_local != (uint8_t *)0x0) {
        fprintf((FILE *)F_out,"\n        ]");
      }
    }
  }
  else {
    inner_val._4_4_ = 0;
    fprintf((FILE *)F_out,"[\n");
    if (_is_undef == -1) {
      inner_type = 1;
      _is_undef = 0xffffffff;
    }
    while( true ) {
      bVar1 = false;
      if ((0 < _is_undef) && (bVar1 = false, in_max_local != (uint8_t *)0x0)) {
        bVar1 = in_max_local < out_buf_local;
      }
      if (!bVar1) goto LAB_001bbfc7;
      if (*in_max_local == 0xff) break;
      inner_val._0_4_ = (int)(uint)*in_max_local >> 5;
      in_max_local = cbor_get_number(in_max_local,(uint8_t *)out_buf_local,
                                     (int64_t *)&stack0xffffffffffffffa0);
      if ((uint)inner_val == 0) {
        if (inner_val._4_4_ != 0) {
          fprintf((FILE *)F_out,",\n");
        }
        inner_val._4_4_ = inner_val._4_4_ + 1;
        val = (int64_t)out_max_local;
        if (uStack_60 == 0) {
          fprintf((FILE *)F_out,"            --query-timeout\n");
        }
        else if (uStack_60 == 1) {
          fprintf((FILE *)F_out,"            --skew-timeout\n");
        }
        else if (uStack_60 == 2) {
          fprintf((FILE *)F_out,"            --snaplen\n");
        }
        else if (uStack_60 == 3) {
          fprintf((FILE *)F_out,"            --promisc\n");
        }
        else if (uStack_60 == 4) {
          fprintf((FILE *)F_out,"            --interfaces\n");
        }
        else if (uStack_60 == 5) {
          fprintf((FILE *)F_out,"            --server-addresses\n");
        }
        else if (uStack_60 == 6) {
          fprintf((FILE *)F_out,"            --vlan-ids\n");
        }
        else if (uStack_60 == 7) {
          fprintf((FILE *)F_out,"            --filter\n");
        }
        else if (uStack_60 == 8) {
          fprintf((FILE *)F_out,"            --query-options\n");
        }
        else if (uStack_60 == 9) {
          fprintf((FILE *)F_out,"            --response-options\n");
        }
        else if (uStack_60 == 10) {
          fprintf((FILE *)F_out,"            --accept-rr-types\n");
        }
        else if (uStack_60 == 0xb) {
          fprintf((FILE *)F_out,"            --ignore-rr-types\n");
        }
        else if (uStack_60 == 0xc) {
          fprintf((FILE *)F_out,"            --max-block-qr-items\n");
        }
        fprintf((FILE *)F_out,"            %d,",uStack_60 & 0xffffffff);
        in_max_local = cbor_to_text(in_max_local,(uint8_t *)out_buf_local,(char **)&val,pcStack_30,
                                    err);
        fwrite(out_max_local,1,val - (long)out_max_local,(FILE *)F_out);
        _is_undef = _is_undef + -1;
      }
      else {
        fprintf((FILE *)F_out,"        Unexpected type: %d(%d)\n",(ulong)(uint)inner_val,
                uStack_60 & 0xffffffff);
        *err = -3;
        in_max_local = (uint8_t *)0x0;
      }
    }
    fprintf((FILE *)F_out,"\n            --end of array");
    if (inner_type == 0) {
      fprintf((FILE *)F_out,"            Error, end of array mark unexpected.\n");
      *err = -3;
      in_max_local = (uint8_t *)0x0;
    }
    else {
      in_max_local = in_max_local + 1;
    }
LAB_001bbfc7:
    if (in_max_local != (uint8_t *)0x0) {
      fprintf((FILE *)F_out,"\n        ]");
    }
  }
  return in_max_local;
}

Assistant:

uint8_t* cdns::dump_block_parameters(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int cdns_version, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in != NULL && outer_type == CBOR_T_MAP && cdns_version == 0) {
        /* Input is in draft-04 format */
        int rank = 0;
        fprintf(F_out, "[\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "\n            --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "            Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "        Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    {
                        /* Type definitions copies fro source code of compactor */
                        p_out = out_buf;
                        if (inner_val == 0) {
                            fprintf(F_out, "            --query-timeout\n");
                        }
                        else if (inner_val == 1) {
                            fprintf(F_out, "            --skew-timeout\n");
                        }
                        else if (inner_val == 2) {
                            fprintf(F_out, "            --snaplen\n");
                        }
                        else if (inner_val == 3) {
                            fprintf(F_out, "            --promisc\n");
                        }
                        else if (inner_val == 4) {
                            fprintf(F_out, "            --interfaces\n"); /* V0.5 only? */
                        }
                        else if (inner_val == 5) {
                            fprintf(F_out, "            --server-addresses\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 6) {
                            fprintf(F_out, "            --vlan-ids\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 7) {
                            fprintf(F_out, "            --filter\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 8) {
                            fprintf(F_out, "            --query-options\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 9) {
                            fprintf(F_out, "            --response-options\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 10) {
                            fprintf(F_out, "            --accept-rr-types\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 11) {
                            fprintf(F_out, "            --ignore-rr-types\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 12) {
                            fprintf(F_out, "            --max-block-qr-items\n"); /* v0.5 only? */
                        }
                        fprintf(F_out, "            %d,", (int)inner_val);
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }


        if (in != NULL) {
            fprintf(F_out, "\n        ]");
        }
    }
    else if (in != NULL && outer_type == CBOR_T_ARRAY && cdns_version == 1) {
        /* Block parameter in Array format */
        int rank = 0;

        fprintf(F_out, " [\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "        --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "        Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                p_out = out_buf;
                fprintf(F_out, "            -- Block parameter %d:\n", rank);
                rank++;

                in = dump_block_parameters_rfc(in, in_max, out_buf, out_max, err, F_out);
                val--;
            }
        }

        if (in != NULL) {
            fprintf(F_out, "\n        ]");
        }
    }
    else {
        fprintf(F_out, "       Error, cannot parse the first bytes of block parameters (version %d), type %d.\n", cdns_version, outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }

    return in;
}